

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

int xmlTextReaderRead(xmlTextReaderPtr reader)

{
  xmlChar *data;
  int iVar1;
  xmlNodePtr pxVar2;
  xmlXIncludeCtxtPtr pxVar3;
  bool bVar4;
  int local_4c;
  int i;
  xmlNodePtr node;
  xmlNodePtr tmp_1;
  xmlNodePtr tmp;
  xmlNodePtr oldnode;
  int local_20;
  xmlTextReaderState oldstate;
  int olddepth;
  int val;
  xmlTextReaderPtr reader_local;
  
  local_20 = 0;
  oldnode._4_4_ = XML_TEXTREADER_START;
  tmp = (xmlNodePtr)0x0;
  if (reader == (xmlTextReaderPtr)0x0) {
    return -1;
  }
  reader->curnode = (xmlNodePtr)0x0;
  if (reader->doc != (xmlDocPtr)0x0) {
    iVar1 = xmlTextReaderReadTree(reader);
    return iVar1;
  }
  if (reader->ctxt == (xmlParserCtxtPtr)0x0) {
    return -1;
  }
  if (reader->mode != 0) {
    oldnode._4_4_ = reader->state;
    local_20 = reader->ctxt->nodeNr;
    tmp = reader->node;
    goto LAB_001ef229;
  }
  reader->mode = 1;
  do {
    iVar1 = xmlTextReaderPushData(reader);
    if (iVar1 < 0) {
      reader->mode = 2;
      reader->state = XML_TEXTREADER_ERROR;
      return -1;
    }
    bVar4 = false;
    if ((reader->ctxt->node == (xmlNodePtr)0x0) && (bVar4 = false, reader->mode != 3)) {
      bVar4 = reader->state != XML_TEXTREADER_DONE;
    }
  } while (bVar4);
  if (reader->ctxt->node == (xmlNodePtr)0x0) {
    if (reader->ctxt->myDoc != (xmlDocPtr)0x0) {
      reader->node = reader->ctxt->myDoc->children;
    }
    if (reader->node == (xmlNodePtr)0x0) {
      reader->mode = 2;
      reader->state = XML_TEXTREADER_ERROR;
      return -1;
    }
    reader->state = XML_TEXTREADER_ELEMENT;
  }
  else {
    if (reader->ctxt->myDoc != (xmlDocPtr)0x0) {
      reader->node = reader->ctxt->myDoc->children;
    }
    if (reader->node == (xmlNodePtr)0x0) {
      reader->node = *reader->ctxt->nodeTab;
    }
    reader->state = XML_TEXTREADER_ELEMENT;
  }
  reader->depth = 0;
  reader->ctxt->parseMode = XML_PARSE_READER;
  do {
    if ((((reader->node != (xmlNodePtr)0x0) && (reader->node->next == (_xmlNode *)0x0)) &&
        ((reader->node->type == XML_TEXT_NODE || (reader->node->type == XML_CDATA_SECTION_NODE))))
       && (pxVar2 = xmlTextReaderExpand(reader), pxVar2 == (xmlNodePtr)0x0)) {
      return -1;
    }
    if (((((reader->xinclude != 0) && (reader->in_xinclude == 0)) &&
         (reader->node != (xmlNodePtr)0x0)) &&
        ((reader->node->type == XML_ELEMENT_NODE && (reader->node->ns != (xmlNs *)0x0)))) &&
       ((iVar1 = xmlStrEqual(reader->node->ns->href,(xmlChar *)"http://www.w3.org/2003/XInclude"),
        iVar1 != 0 ||
        (iVar1 = xmlStrEqual(reader->node->ns->href,(xmlChar *)"http://www.w3.org/2001/XInclude"),
        iVar1 != 0)))) {
      if (reader->xincctxt == (xmlXIncludeCtxtPtr)0x0) {
        pxVar3 = xmlXIncludeNewContext(reader->ctxt->myDoc);
        reader->xincctxt = pxVar3;
        xmlXIncludeSetFlags(reader->xincctxt,reader->parserFlags & 0xffff7fff);
      }
      pxVar2 = xmlTextReaderExpand(reader);
      if (pxVar2 == (xmlNodePtr)0x0) {
        return -1;
      }
      xmlXIncludeProcessNode(reader->xincctxt,reader->node);
    }
    if ((reader->node == (xmlNodePtr)0x0) || (reader->node->type != XML_XINCLUDE_START)) {
      if ((reader->node == (xmlNodePtr)0x0) || (reader->node->type != XML_XINCLUDE_END)) {
        if ((((reader->node == (xmlNodePtr)0x0) || (reader->node->type != XML_ENTITY_REF_NODE)) ||
            (reader->ctxt == (xmlParserCtxtPtr)0x0)) || (reader->ctxt->replaceEntities != 1)) {
          if ((((reader->node != (xmlNodePtr)0x0) && (reader->node->type == XML_ENTITY_REF_NODE)) &&
              (reader->ctxt != (xmlParserCtxtPtr)0x0)) &&
             (reader->validate != XML_TEXTREADER_NOT_VALIDATE)) {
            xmlTextReaderValidateEntity(reader);
          }
        }
        else if (((reader->node->children != (_xmlNode *)0x0) &&
                 (reader->node->children->type == XML_ENTITY_DECL)) &&
                (reader->node->children->children != (_xmlNode *)0x0)) {
          xmlTextReaderEntPush(reader,reader->node);
          reader->node = reader->node->children->children;
        }
        if ((((reader->node == (xmlNodePtr)0x0) || (reader->node->type != XML_ENTITY_DECL)) ||
            (reader->ent == (xmlNodePtr)0x0)) || (reader->ent->children != reader->node)) {
          if ((reader->validate != XML_TEXTREADER_NOT_VALIDATE) && (reader->node != (xmlNodePtr)0x0)
             ) {
            pxVar2 = reader->node;
            if ((pxVar2->type == XML_ELEMENT_NODE) &&
               ((reader->state != XML_TEXTREADER_END && (reader->state != XML_TEXTREADER_BACKTRACK))
               )) {
              xmlTextReaderValidatePush(reader);
            }
            else if ((pxVar2->type == XML_TEXT_NODE) || (pxVar2->type == XML_CDATA_SECTION_NODE)) {
              data = pxVar2->content;
              iVar1 = xmlStrlen(pxVar2->content);
              xmlTextReaderValidateCData(reader,data,iVar1);
            }
          }
          if (((reader->patternNr < 1) || (reader->state == XML_TEXTREADER_END)) ||
             (reader->state == XML_TEXTREADER_BACKTRACK)) goto LAB_001efc13;
          local_4c = 0;
          break;
        }
        pxVar2 = xmlTextReaderEntPop(reader);
        reader->node = pxVar2;
        reader->depth = reader->depth + 1;
      }
      else {
        reader->in_xinclude = reader->in_xinclude + -1;
      }
    }
    else {
      reader->in_xinclude = reader->in_xinclude + 1;
    }
LAB_001ef229:
    if (reader->node == (xmlNodePtr)0x0) {
      if (reader->mode == 3) {
        return 0;
      }
      return -1;
    }
    while( true ) {
      bVar4 = false;
      if (((((reader->node != (xmlNodePtr)0x0) &&
            (bVar4 = false, reader->node->next == (_xmlNode *)0x0)) &&
           (bVar4 = false, reader->ctxt->nodeNr == local_20)) &&
          ((((oldnode._4_4_ == XML_TEXTREADER_BACKTRACK ||
             (reader->node->children == (_xmlNode *)0x0)) ||
            (reader->node->type == XML_ENTITY_REF_NODE)) ||
           ((((reader->node->children != (_xmlNode *)0x0 &&
              (reader->node->children->type == XML_TEXT_NODE)) &&
             (reader->node->children->next == (_xmlNode *)0x0)) ||
            (((reader->node->type == XML_DTD_NODE || (reader->node->type == XML_DOCUMENT_NODE)) ||
             (bVar4 = false, reader->node->type == XML_HTML_DOCUMENT_NODE)))))))) &&
         (((reader->ctxt->node == (xmlNodePtr)0x0 || (reader->ctxt->node == reader->node)) ||
          (bVar4 = false, reader->ctxt->node == reader->node->parent)))) {
        bVar4 = reader->ctxt->instate != XML_PARSER_EOF;
      }
      if (!bVar4) break;
      iVar1 = xmlTextReaderPushData(reader);
      if (iVar1 < 0) {
        reader->mode = 2;
        reader->state = XML_TEXTREADER_ERROR;
        return -1;
      }
      if (reader->node == (xmlNodePtr)0x0) goto LAB_001efc68;
    }
    if (((oldnode._4_4_ == XML_TEXTREADER_BACKTRACK) || (reader->node->children == (_xmlNode *)0x0))
       || ((reader->node->type == XML_ENTITY_REF_NODE ||
           ((reader->node->type == XML_XINCLUDE_START || (reader->node->type == XML_DTD_NODE)))))) {
      if (reader->node->next == (_xmlNode *)0x0) {
        if ((((oldnode._4_4_ == XML_TEXTREADER_ELEMENT) && (reader->node->type == XML_ELEMENT_NODE))
            && (reader->node->children == (_xmlNode *)0x0)) && ((reader->node->extra & 1) == 0)) {
          reader->state = XML_TEXTREADER_END;
        }
        else {
          if ((reader->validate != XML_TEXTREADER_NOT_VALIDATE) &&
             (reader->node->type == XML_ELEMENT_NODE)) {
            xmlTextReaderValidatePop(reader);
          }
          if ((0 < reader->preserves) && ((reader->node->extra & 4) != 0)) {
            reader->preserves = reader->preserves + -1;
          }
          reader->node = reader->node->parent;
          if ((((reader->node == (xmlNodePtr)0x0) || (reader->node->type == XML_DOCUMENT_NODE)) ||
              (reader->node->type == XML_DOCB_DOCUMENT_NODE)) ||
             (reader->node->type == XML_HTML_DOCUMENT_NODE)) {
            if (reader->mode != 3) {
              iVar1 = xmlParseChunk(reader->ctxt,"",0,1);
              reader->state = XML_TEXTREADER_DONE;
              if (iVar1 != 0) {
                return -1;
              }
            }
            reader->node = (xmlNodePtr)0x0;
            reader->depth = -1;
            if ((((tmp != (xmlNodePtr)0x0) && (reader->preserves == 0)) &&
                ((reader->in_xinclude == 0 && ((reader->entNr == 0 && (tmp->type != XML_DTD_NODE))))
                )) && ((tmp->extra & 2) == 0)) {
              xmlUnlinkNode(tmp);
              xmlTextReaderFreeNode(reader,tmp);
            }
LAB_001efc68:
            reader->state = XML_TEXTREADER_DONE;
            return 0;
          }
          if ((((reader->preserves == 0) && (reader->in_xinclude == 0)) && (reader->entNr == 0)) &&
             ((reader->node->last != (_xmlNode *)0x0 && ((reader->node->last->extra & 2) == 0)))) {
            pxVar2 = reader->node->last;
            xmlUnlinkNode(pxVar2);
            xmlTextReaderFreeNode(reader,pxVar2);
          }
          reader->depth = reader->depth + -1;
          reader->state = XML_TEXTREADER_BACKTRACK;
        }
      }
      else if (((oldnode._4_4_ == XML_TEXTREADER_ELEMENT) &&
               (reader->node->type == XML_ELEMENT_NODE)) &&
              ((reader->node->children == (_xmlNode *)0x0 &&
               (((reader->node->extra & 1) == 0 && (reader->in_xinclude < 1)))))) {
        reader->state = XML_TEXTREADER_END;
      }
      else {
        if ((reader->validate != XML_TEXTREADER_NOT_VALIDATE) &&
           (reader->node->type == XML_ELEMENT_NODE)) {
          xmlTextReaderValidatePop(reader);
        }
        if ((0 < reader->preserves) && ((reader->node->extra & 4) != 0)) {
          reader->preserves = reader->preserves + -1;
        }
        reader->node = reader->node->next;
        reader->state = XML_TEXTREADER_ELEMENT;
        if (((((reader->preserves == 0) && (reader->in_xinclude == 0)) && (reader->entNr == 0)) &&
            ((reader->node->prev != (_xmlNode *)0x0 && (reader->node->prev->type != XML_DTD_NODE))))
           && (pxVar2 = reader->node->prev, (pxVar2->extra & 2) == 0)) {
          if (tmp == pxVar2) {
            tmp = (xmlNodePtr)0x0;
          }
          xmlUnlinkNode(pxVar2);
          xmlTextReaderFreeNode(reader,pxVar2);
        }
      }
    }
    else {
      reader->node = reader->node->children;
      reader->depth = reader->depth + 1;
      reader->state = XML_TEXTREADER_ELEMENT;
    }
  } while( true );
LAB_001efbc5:
  if (reader->patternNr <= local_4c) {
LAB_001efc13:
    if (((reader->validate == XML_TEXTREADER_VALIDATE_XSD) && (reader->xsdValidErrors == 0)) &&
       (reader->xsdValidCtxt != (xmlSchemaValidCtxtPtr)0x0)) {
      iVar1 = xmlSchemaIsValid(reader->xsdValidCtxt);
      reader->xsdValidErrors = (uint)((iVar1 != 0 ^ 0xffU) & 1);
    }
    return 1;
  }
  iVar1 = xmlPatternMatch(reader->patternTab[local_4c],reader->node);
  if (iVar1 == 1) {
    xmlTextReaderPreserve(reader);
    goto LAB_001efc13;
  }
  local_4c = local_4c + 1;
  goto LAB_001efbc5;
}

Assistant:

int
xmlTextReaderRead(xmlTextReaderPtr reader) {
    int val, olddepth = 0;
    xmlTextReaderState oldstate = XML_TEXTREADER_START;
    xmlNodePtr oldnode = NULL;


    if (reader == NULL)
	return(-1);
    reader->curnode = NULL;
    if (reader->doc != NULL)
        return(xmlTextReaderReadTree(reader));
    if (reader->ctxt == NULL)
	return(-1);

#ifdef DEBUG_READER
    fprintf(stderr, "\nREAD ");
    DUMP_READER
#endif
    if (reader->mode == XML_TEXTREADER_MODE_INITIAL) {
	reader->mode = XML_TEXTREADER_MODE_INTERACTIVE;
	/*
	 * Initial state
	 */
	do {
	    val = xmlTextReaderPushData(reader);
		if (val < 0){
			reader->mode = XML_TEXTREADER_MODE_ERROR;
			reader->state = XML_TEXTREADER_ERROR;
		return(-1);
		}
	} while ((reader->ctxt->node == NULL) &&
		 ((reader->mode != XML_TEXTREADER_MODE_EOF) &&
		  (reader->state != XML_TEXTREADER_DONE)));
	if (reader->ctxt->node == NULL) {
	    if (reader->ctxt->myDoc != NULL) {
		reader->node = reader->ctxt->myDoc->children;
	    }
	    if (reader->node == NULL){
			reader->mode = XML_TEXTREADER_MODE_ERROR;
			reader->state = XML_TEXTREADER_ERROR;
		return(-1);
		}
	    reader->state = XML_TEXTREADER_ELEMENT;
	} else {
	    if (reader->ctxt->myDoc != NULL) {
		reader->node = reader->ctxt->myDoc->children;
	    }
	    if (reader->node == NULL)
		reader->node = reader->ctxt->nodeTab[0];
	    reader->state = XML_TEXTREADER_ELEMENT;
	}
	reader->depth = 0;
	reader->ctxt->parseMode = XML_PARSE_READER;
	goto node_found;
    }
    oldstate = reader->state;
    olddepth = reader->ctxt->nodeNr;
    oldnode = reader->node;

get_next_node:
    if (reader->node == NULL) {
	if (reader->mode == XML_TEXTREADER_MODE_EOF)
	    return(0);
	else
	    return(-1);
    }

    /*
     * If we are not backtracking on ancestors or examined nodes,
     * that the parser didn't finished or that we aren't at the end
     * of stream, continue processing.
     */
    while ((reader->node != NULL) && (reader->node->next == NULL) &&
	   (reader->ctxt->nodeNr == olddepth) &&
           ((oldstate == XML_TEXTREADER_BACKTRACK) ||
            (reader->node->children == NULL) ||
	    (reader->node->type == XML_ENTITY_REF_NODE) ||
	    ((reader->node->children != NULL) &&
	     (reader->node->children->type == XML_TEXT_NODE) &&
	     (reader->node->children->next == NULL)) ||
	    (reader->node->type == XML_DTD_NODE) ||
	    (reader->node->type == XML_DOCUMENT_NODE) ||
	    (reader->node->type == XML_HTML_DOCUMENT_NODE)) &&
	   ((reader->ctxt->node == NULL) ||
	    (reader->ctxt->node == reader->node) ||
	    (reader->ctxt->node == reader->node->parent)) &&
	   (reader->ctxt->instate != XML_PARSER_EOF)) {
	val = xmlTextReaderPushData(reader);
	if (val < 0){
		reader->mode = XML_TEXTREADER_MODE_ERROR;
		reader->state = XML_TEXTREADER_ERROR;
	    return(-1);
	}
	if (reader->node == NULL)
	    goto node_end;
    }
    if (oldstate != XML_TEXTREADER_BACKTRACK) {
	if ((reader->node->children != NULL) &&
	    (reader->node->type != XML_ENTITY_REF_NODE) &&
	    (reader->node->type != XML_XINCLUDE_START) &&
	    (reader->node->type != XML_DTD_NODE)) {
	    reader->node = reader->node->children;
	    reader->depth++;
	    reader->state = XML_TEXTREADER_ELEMENT;
	    goto node_found;
	}
    }
    if (reader->node->next != NULL) {
	if ((oldstate == XML_TEXTREADER_ELEMENT) &&
            (reader->node->type == XML_ELEMENT_NODE) &&
	    (reader->node->children == NULL) &&
	    ((reader->node->extra & NODE_IS_EMPTY) == 0)
#ifdef LIBXML_XINCLUDE_ENABLED
	    && (reader->in_xinclude <= 0)
#endif
	    ) {
	    reader->state = XML_TEXTREADER_END;
	    goto node_found;
	}
#ifdef LIBXML_REGEXP_ENABLED
	if ((reader->validate) &&
	    (reader->node->type == XML_ELEMENT_NODE))
	    xmlTextReaderValidatePop(reader);
#endif /* LIBXML_REGEXP_ENABLED */
        if ((reader->preserves > 0) &&
	    (reader->node->extra & NODE_IS_SPRESERVED))
	    reader->preserves--;
	reader->node = reader->node->next;
	reader->state = XML_TEXTREADER_ELEMENT;

	/*
	 * Cleanup of the old node
	 */
	if ((reader->preserves == 0) &&
#ifdef LIBXML_XINCLUDE_ENABLED
	    (reader->in_xinclude == 0) &&
#endif
	    (reader->entNr == 0) &&
	    (reader->node->prev != NULL) &&
            (reader->node->prev->type != XML_DTD_NODE)) {
	    xmlNodePtr tmp = reader->node->prev;
	    if ((tmp->extra & NODE_IS_PRESERVED) == 0) {
                if (oldnode == tmp)
                    oldnode = NULL;
		xmlUnlinkNode(tmp);
		xmlTextReaderFreeNode(reader, tmp);
	    }
	}

	goto node_found;
    }
    if ((oldstate == XML_TEXTREADER_ELEMENT) &&
	(reader->node->type == XML_ELEMENT_NODE) &&
	(reader->node->children == NULL) &&
	((reader->node->extra & NODE_IS_EMPTY) == 0)) {;
	reader->state = XML_TEXTREADER_END;
	goto node_found;
    }
#ifdef LIBXML_REGEXP_ENABLED
    if ((reader->validate != XML_TEXTREADER_NOT_VALIDATE) && (reader->node->type == XML_ELEMENT_NODE))
	xmlTextReaderValidatePop(reader);
#endif /* LIBXML_REGEXP_ENABLED */
    if ((reader->preserves > 0) &&
	(reader->node->extra & NODE_IS_SPRESERVED))
	reader->preserves--;
    reader->node = reader->node->parent;
    if ((reader->node == NULL) ||
	(reader->node->type == XML_DOCUMENT_NODE) ||
#ifdef LIBXML_DOCB_ENABLED
	(reader->node->type == XML_DOCB_DOCUMENT_NODE) ||
#endif
	(reader->node->type == XML_HTML_DOCUMENT_NODE)) {
	if (reader->mode != XML_TEXTREADER_MODE_EOF) {
	    val = xmlParseChunk(reader->ctxt, "", 0, 1);
	    reader->state = XML_TEXTREADER_DONE;
	    if (val != 0)
	        return(-1);
	}
	reader->node = NULL;
	reader->depth = -1;

	/*
	 * Cleanup of the old node
	 */
	if ((oldnode != NULL) && (reader->preserves == 0) &&
#ifdef LIBXML_XINCLUDE_ENABLED
	    (reader->in_xinclude == 0) &&
#endif
	    (reader->entNr == 0) &&
	    (oldnode->type != XML_DTD_NODE) &&
	    ((oldnode->extra & NODE_IS_PRESERVED) == 0)) {
	    xmlUnlinkNode(oldnode);
	    xmlTextReaderFreeNode(reader, oldnode);
	}

	goto node_end;
    }
    if ((reader->preserves == 0) &&
#ifdef LIBXML_XINCLUDE_ENABLED
        (reader->in_xinclude == 0) &&
#endif
	(reader->entNr == 0) &&
        (reader->node->last != NULL) &&
        ((reader->node->last->extra & NODE_IS_PRESERVED) == 0)) {
	xmlNodePtr tmp = reader->node->last;
	xmlUnlinkNode(tmp);
	xmlTextReaderFreeNode(reader, tmp);
    }
    reader->depth--;
    reader->state = XML_TEXTREADER_BACKTRACK;

node_found:
    DUMP_READER

    /*
     * If we are in the middle of a piece of CDATA make sure it's finished
     */
    if ((reader->node != NULL) &&
        (reader->node->next == NULL) &&
        ((reader->node->type == XML_TEXT_NODE) ||
	 (reader->node->type == XML_CDATA_SECTION_NODE))) {
            if (xmlTextReaderExpand(reader) == NULL)
	        return -1;
    }

#ifdef LIBXML_XINCLUDE_ENABLED
    /*
     * Handle XInclude if asked for
     */
    if ((reader->xinclude) && (reader->in_xinclude == 0) &&
        (reader->node != NULL) &&
	(reader->node->type == XML_ELEMENT_NODE) &&
	(reader->node->ns != NULL) &&
	((xmlStrEqual(reader->node->ns->href, XINCLUDE_NS)) ||
	 (xmlStrEqual(reader->node->ns->href, XINCLUDE_OLD_NS)))) {
	if (reader->xincctxt == NULL) {
	    reader->xincctxt = xmlXIncludeNewContext(reader->ctxt->myDoc);
	    xmlXIncludeSetFlags(reader->xincctxt,
	                        reader->parserFlags & (~XML_PARSE_NOXINCNODE));
	}